

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

size_t __thiscall wasm::IRBuilder::ChildPopper::Constraint::size(Constraint *this)

{
  __index_type _Var1;
  size_t sVar2;
  Type local_18;
  optional<wasm::Type> type;
  
  _Var1 = *(__index_type *)
           ((long)&(this->
                   super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   ).
                   super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   .
                   super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   .
                   super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   .
                   super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   .
                   super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                   .
                   super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           + 8);
  local_18.id = *(uintptr_t *)
                 &(this->
                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  ).
                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  ;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ = _Var1 == '\0';
  if ((bool)type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_) {
    sVar2 = wasm::Type::size(&local_18);
  }
  else {
    sVar2 = 1;
    if (_Var1 == '\x03') {
      sVar2 = local_18.id;
    }
  }
  return sVar2;
}

Assistant:

size_t size() const {
      if (auto type = getSubtype()) {
        return type->size();
      }
      if (auto arity = getAnyTuple()) {
        return *arity;
      }
      return 1;
    }